

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

int EncoderInit(VP8LEncoder *enc)

{
  int iVar1;
  int size;
  long lVar2;
  
  size = enc->pic->height * enc->pic->width;
  iVar1 = VP8LHashChainInit(&enc->hash_chain,size);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    for (lVar2 = 0; lVar2 != 0xa0; lVar2 = lVar2 + 0x28) {
      VP8LBackwardRefsInit
                ((VP8LBackwardRefs *)((long)&enc->refs[0].block_size + lVar2),(size + -1) / 0x10 + 1
                );
    }
  }
  return iVar1;
}

Assistant:

static int EncoderInit(VP8LEncoder* const enc) {
  const WebPPicture* const pic = enc->pic;
  const int width = pic->width;
  const int height = pic->height;
  const int pix_cnt = width * height;
  // we round the block size up, so we're guaranteed to have
  // at most MAX_REFS_BLOCK_PER_IMAGE blocks used:
  const int refs_block_size = (pix_cnt - 1) / MAX_REFS_BLOCK_PER_IMAGE + 1;
  int i;
  if (!VP8LHashChainInit(&enc->hash_chain, pix_cnt)) return 0;

  for (i = 0; i < 4; ++i) VP8LBackwardRefsInit(&enc->refs[i], refs_block_size);

  return 1;
}